

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall
CcsTest_InterpolationIsDoneAtLoadTime_Test::~CcsTest_InterpolationIsDoneAtLoadTime_Test
          (CcsTest_InterpolationIsDoneAtLoadTime_Test *this)

{
  CcsTest_InterpolationIsDoneAtLoadTime_Test *this_local;
  
  ~CcsTest_InterpolationIsDoneAtLoadTime_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, InterpolationIsDoneAtLoadTime) {
  CcsDomain ccs;
  std::istringstream input("a = 'foo${VAR1} baz'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  EXPECT_EQ("foo baz", ctx.getString("a"));
  setenv("VAR1", "bar", true);
  EXPECT_EQ("foo baz", ctx.getString("a"));
  unsetenv("VAR1");
}